

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_fixed.cc
# Opt level: O0

bool absl::lts_20250127::time_internal::cctz::FixedOffsetFromName(string *name,seconds *offset)

{
  bool bVar1;
  duration<long,_std::ratio<1L,_1L>_> dVar2;
  long lVar3;
  int local_64;
  rep local_60;
  int local_54;
  int local_50;
  int secs;
  int mins;
  int hours;
  char *np;
  char *local_38;
  char *ep;
  size_t prefix_len;
  seconds *local_20;
  seconds *offset_local;
  string *name_local;
  
  local_20 = offset;
  offset_local = (seconds *)name;
  bVar1 = std::operator==(name,"UTC");
  if ((bVar1) ||
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              offset_local,"UTC0"), bVar1)) {
    dVar2 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::zero();
    local_20->__r = dVar2.__r;
    return true;
  }
  ep = (char *)0x9;
  local_38 = "";
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0x12) {
    return false;
  }
  np = (char *)std::__cxx11::string::begin();
  bVar1 = std::equal<char_const*,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ("Fixed/UTC","",
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )np);
  if (!bVar1) {
    return false;
  }
  lVar3 = std::__cxx11::string::data();
  _mins = (char *)(lVar3 + 9);
  if ((*_mins != '+') && (*_mins != '-')) {
    return false;
  }
  if ((*(char *)(lVar3 + 0xc) == ':') && (*(char *)(lVar3 + 0xf) == ':')) {
    secs = anon_unknown_0::Parse02d((char *)(lVar3 + 10));
    if (secs == -1) {
      return false;
    }
    local_50 = anon_unknown_0::Parse02d(_mins + 4);
    if (local_50 == -1) {
      return false;
    }
    local_54 = anon_unknown_0::Parse02d(_mins + 7);
    if (local_54 == -1) {
      return false;
    }
    local_54 = (secs * 0x3c + local_50) * 0x3c + local_54;
    if (0x15180 < local_54) {
      return false;
    }
    local_64 = 1;
    if (*_mins == '-') {
      local_64 = -1;
    }
    local_64 = local_54 * local_64;
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1l>> *)&local_60,&local_64);
    local_20->__r = local_60;
    return true;
  }
  return false;
}

Assistant:

bool FixedOffsetFromName(const std::string& name, seconds* offset) {
  if (name == "UTC" || name == "UTC0") {
    *offset = seconds::zero();
    return true;
  }

  const std::size_t prefix_len = sizeof(kFixedZonePrefix) - 1;
  const char* const ep = kFixedZonePrefix + prefix_len;
  if (name.size() != prefix_len + 9)  // <prefix>+99:99:99
    return false;
  if (!std::equal(kFixedZonePrefix, ep, name.begin())) return false;
  const char* np = name.data() + prefix_len;
  if (np[0] != '+' && np[0] != '-') return false;
  if (np[3] != ':' || np[6] != ':')  // see note below about large offsets
    return false;

  int hours = Parse02d(np + 1);
  if (hours == -1) return false;
  int mins = Parse02d(np + 4);
  if (mins == -1) return false;
  int secs = Parse02d(np + 7);
  if (secs == -1) return false;

  secs += ((hours * 60) + mins) * 60;
  if (secs > 24 * 60 * 60) return false;  // outside supported offset range
  *offset = seconds(secs * (np[0] == '-' ? -1 : 1));  // "-" means west
  return true;
}